

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Comm_split_type
              (MPIABI_Comm comm,int split_type,int key,MPIABI_Info info,MPIABI_Comm *newcomm)

{
  int iVar1;
  
  iVar1 = MPI_Comm_split_type();
  return iVar1;
}

Assistant:

int MPIABI_Comm_split_type(
  MPIABI_Comm comm,
  int split_type,
  int key,
  MPIABI_Info info,
  MPIABI_Comm * newcomm
) {
  return MPI_Comm_split_type(
    (MPI_Comm)(WPI_Comm)comm,
    split_type,
    key,
    (MPI_Info)(WPI_Info)info,
    (MPI_Comm *)(WPI_CommPtr)newcomm
  );
}